

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall Node::AddValidationOutEdge(Node *this,Edge *edge)

{
  Edge *local_8;
  
  local_8 = edge;
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back(&this->validation_out_edges_,&local_8);
  return;
}

Assistant:

void AddValidationOutEdge(Edge* edge) { validation_out_edges_.push_back(edge); }